

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::testBufferNegativeOffset(ErrorsTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  undefined4 *puVar7;
  Enum<int,_2UL> EVar8;
  Enum<int,_2UL> local_6a8;
  MessageBuilder local_698;
  GetNameFunc local_518;
  int local_510;
  Enum<int,_2UL> local_508;
  MessageBuilder local_4f8;
  GetNameFunc local_378;
  int local_370;
  Enum<int,_2UL> local_368;
  MessageBuilder local_358;
  GetNameFunc local_1d8;
  int local_1d0;
  Enum<int,_2UL> local_1c8;
  MessageBuilder local_1b8;
  int local_38;
  GLenum error;
  GLuint local_24;
  GLuint local_20;
  GLuint query;
  GLuint buffer;
  bool is_error;
  bool is_ok;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _buffer = CONCAT44(extraout_var,iVar1);
  query._3_1_ = 1;
  query._2_1_ = 0;
  local_20 = 0;
  local_24 = 0;
  (**(code **)(_buffer + 0x6c8))(1,&local_20);
  dVar2 = (**(code **)(_buffer + 0x800))();
  glu::checkError(dVar2,"glGenBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x479);
  (**(code **)(_buffer + 0x40))(0x8c8e,local_20);
  dVar2 = (**(code **)(_buffer + 0x800))();
  glu::checkError(dVar2,"glBindBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x47c);
  (**(code **)(_buffer + 0x150))(0x8c8e,8,0,0x88ea);
  dVar2 = (**(code **)(_buffer + 0x800))();
  glu::checkError(dVar2,"glBindBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x47f);
  (**(code **)(_buffer + 0x3d8))(0x8914,1,&local_24);
  dVar2 = (**(code **)(_buffer + 0x800))();
  glu::checkError(dVar2,"glCreateQueries have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x483);
  (*this->m_pGetQueryBufferObjectiv)(local_24,local_20,0x8867,-1);
  local_38 = (**(code **)(_buffer + 0x800))();
  if (local_38 != 0x501) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [70])
                        "glGetQueryBufferObjectiv called with negative offset generated error ");
    EVar8 = glu::getErrorStr(local_38);
    local_1d8 = EVar8.m_getName;
    local_1d0 = EVar8.m_value;
    local_1c8.m_getName = local_1d8;
    local_1c8.m_value = local_1d0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1c8);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [41])", however GL_INVALID_VALUE was expected.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjectuiv)(local_24,local_20,0x8867,-1);
  local_38 = (**(code **)(_buffer + 0x800))();
  if (local_38 != 0x501) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_358,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_358,
                        (char (*) [71])
                        "glGetQueryBufferObjectuiv called with negative offset generated error ");
    EVar8 = glu::getErrorStr(local_38);
    local_378 = EVar8.m_getName;
    local_370 = EVar8.m_value;
    local_368.m_getName = local_378;
    local_368.m_value = local_370;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_368);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [41])", however GL_INVALID_VALUE was expected.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjecti64v)(local_24,local_20,0x8867,-1);
  local_38 = (**(code **)(_buffer + 0x800))();
  if (local_38 != 0x501) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_4f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4f8,
                        (char (*) [72])
                        "glGetQueryBufferObjecti64v called with negative offset generated error ");
    EVar8 = glu::getErrorStr(local_38);
    local_518 = EVar8.m_getName;
    local_510 = EVar8.m_value;
    local_508.m_getName = local_518;
    local_508.m_value = local_510;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_508);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [41])", however GL_INVALID_VALUE was expected.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4f8);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjectui64v)(local_24,local_20,0x8867,-1);
  local_38 = (**(code **)(_buffer + 0x800))();
  if (local_38 != 0x501) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_698,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_698,
                        (char (*) [73])
                        "glGetQueryBufferObjectui64v called with negative offset generated error ");
    EVar8 = glu::getErrorStr(local_38);
    local_6a8.m_getName = EVar8.m_getName;
    local_6a8.m_value = EVar8.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_6a8);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [41])", however GL_INVALID_VALUE was expected.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_698);
    query._3_1_ = 0;
  }
  if (local_24 != 0) {
    (**(code **)(_buffer + 0x458))(1,&local_24);
  }
  if (local_20 != 0) {
    (**(code **)(_buffer + 0x438))(1,&local_20);
  }
  do {
    iVar1 = (**(code **)(_buffer + 0x800))();
  } while (iVar1 != 0);
  if ((query._2_1_ & 1) == 0) {
    return (bool)(query._3_1_ & 1);
  }
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0;
  __cxa_throw(puVar7,&int::typeinfo,0);
}

Assistant:

bool ErrorsTest::testBufferNegativeOffset()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Default result. */
	bool is_ok	= true;
	bool is_error = false;

	/* Test's objects. */
	glw::GLuint buffer = 0;
	glw::GLuint query  = 0;

	try
	{
		/* Creating buffer for the test. */
		gl.genBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers have failed");

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(glw::GLint64), DE_NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		/* Create query object for the test. */
		gl.createQueries(s_targets[0], 1, &query);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateQueries have failed");

		/* Test query with negative offset (integer version). */
		m_pGetQueryBufferObjectiv(query, buffer, GL_QUERY_RESULT_AVAILABLE, -1);

		glw::GLenum error = gl.getError();

		if (GL_INVALID_VALUE != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glGetQueryBufferObjectiv called with negative offset generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_VALUE was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query with negative offset (unsigned integer version). */
		m_pGetQueryBufferObjectuiv(query, buffer, GL_QUERY_RESULT_AVAILABLE, -1);

		error = gl.getError();

		if (GL_INVALID_VALUE != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glGetQueryBufferObjectuiv called with negative offset generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_VALUE was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query with negative offset (64-bit integer version). */
		m_pGetQueryBufferObjecti64v(query, buffer, GL_QUERY_RESULT_AVAILABLE, -1);

		error = gl.getError();

		if (GL_INVALID_VALUE != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glGetQueryBufferObjecti64v called with negative offset generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_VALUE was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query with negative offset (64-bit unsigned integer version). */
		m_pGetQueryBufferObjectui64v(query, buffer, GL_QUERY_RESULT_AVAILABLE, -1);

		error = gl.getError();

		if (GL_INVALID_VALUE != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glGetQueryBufferObjectui64v called with negative offset generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_VALUE was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}
	catch (...)
	{
		is_error = true;
	}

	/* Releasing objects. */
	if (query)
	{
		gl.deleteQueries(1, &query);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
	}

	/* Error cleanup. */
	while (gl.getError())
		;

	if (is_error)
	{
		throw 0;
	}

	return is_ok;
}